

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  UniDirectionalLSTMLayerParams *pUVar4;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this_00;
  LSTMWeightParams *pLVar5;
  LSTMParams *pLVar6;
  uint64 uVar7;
  string *psVar8;
  WeightParams *pWVar9;
  uint64_t uVar10;
  allocator local_981;
  string local_980;
  allocator local_959;
  string local_958;
  Result local_938;
  allocator local_909;
  string local_908;
  allocator local_8e1;
  string local_8e0;
  Result local_8c0;
  allocator local_891;
  string local_890;
  allocator local_869;
  string local_868;
  Result local_848;
  allocator local_819;
  string local_818;
  allocator local_7f1;
  string local_7f0;
  Result local_7d0;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  Result local_758;
  allocator local_729;
  string local_728;
  allocator local_701;
  string local_700;
  Result local_6e0;
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  Result local_668;
  allocator local_639;
  string local_638;
  allocator local_611;
  string local_610;
  Result local_5f0;
  allocator local_5c1;
  string local_5c0;
  allocator local_599;
  string local_598;
  Result local_578;
  allocator local_549;
  string local_548;
  allocator local_521;
  string local_520;
  Result local_500;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  Result local_488;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  Result local_410;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  Result local_398;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  Result local_320;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  Result local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  string err;
  uint64_t h;
  uint64_t x;
  UniDirectionalLSTMLayerParams recurrent;
  Result local_1c0;
  Result local_198;
  reference local_170;
  ActivationParams *activation;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,3);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,3,3);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar2 = Result::good((Result *)local_48);
  if (!bVar2) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a2cbed;
  }
  bVar2 = Result::good((Result *)local_48);
  uVar1 = r.m_message.field_2._8_8_;
  if (!bVar2) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a2cbed;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"UniDirectionalLSTM",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar1,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar2 = Result::good((Result *)local_48);
    uVar1 = r.m_message.field_2._8_8_;
    if (!bVar2) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a2cbed;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"UniDirectionalLSTM",(allocator *)((long)&__range1 + 7));
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar1,&local_148,5,5,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    bVar2 = Result::good((Result *)local_48);
    if (!bVar2) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a2cbed;
    }
  }
  pUVar4 = Specification::NeuralNetworkLayer::unidirectionallstm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  this_00 = Specification::UniDirectionalLSTMLayerParams::activations(pUVar4);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                     (this_00);
  activation = (ActivationParams *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                         (this_00);
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end1,(iterator *)&activation), bVar2) {
    local_170 = google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*
                          (&__end1);
    validateRecurrentActivationParams(&local_198,local_170);
    Result::operator=((Result *)local_48,&local_198);
    Result::~Result(&local_198);
    bVar2 = Result::good((Result *)local_48);
    if (!bVar2) break;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end1);
  }
  pUVar4 = Specification::NeuralNetworkLayer::unidirectionallstm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams(pUVar4);
  pUVar4 = Specification::NeuralNetworkLayer::unidirectionallstm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  pLVar6 = Specification::UniDirectionalLSTMLayerParams::params(pUVar4);
  Specification::LSTMParams::LSTMParams((LSTMParams *)&recurrent.reverseinput_,pLVar6);
  validateLSTMWeightParams(&local_1c0,pLVar5,(LSTMParams *)&recurrent.reverseinput_);
  Result::operator=((Result *)local_48,&local_1c0);
  Result::~Result(&local_1c0);
  Specification::LSTMParams::~LSTMParams((LSTMParams *)&recurrent.reverseinput_);
  bVar2 = Result::good((Result *)local_48);
  if (!bVar2) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a2cbed;
  }
  pUVar4 = Specification::NeuralNetworkLayer::unidirectionallstm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)&x,pUVar4);
  uVar7 = Specification::UniDirectionalLSTMLayerParams::inputvectorsize
                    ((UniDirectionalLSTMLayerParams *)&x);
  err.field_2._8_8_ =
       Specification::UniDirectionalLSTMLayerParams::outputvectorsize
                 ((UniDirectionalLSTMLayerParams *)&x);
  iVar3 = Specification::UniDirectionalLSTMLayerParams::activations_size
                    ((UniDirectionalLSTMLayerParams *)&x);
  if (iVar3 == 3) {
    pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                       ((UniDirectionalLSTMLayerParams *)&x);
    pWVar9 = Specification::LSTMWeightParams::inputgateweightmatrix(pLVar5);
    uVar1 = err.field_2._8_8_;
    uVar10 = err.field_2._8_8_ * uVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"Unidirectional LSTM",&local_2c9);
    psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"input gate weight matrix",&local_2f1);
    validateGeneralWeightParams(&local_2a8,pWVar9,uVar10,uVar1,&local_2c8,psVar8,&local_2f0);
    Result::operator=((Result *)local_48,&local_2a8);
    Result::~Result(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    bVar2 = Result::good((Result *)local_48);
    if (bVar2) {
      pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                         ((UniDirectionalLSTMLayerParams *)&x);
      pWVar9 = Specification::LSTMWeightParams::forgetgateweightmatrix(pLVar5);
      uVar1 = err.field_2._8_8_;
      uVar10 = err.field_2._8_8_ * uVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"Unidirectional LSTM",&local_341);
      psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_368,"forget gate weight matrix",&local_369);
      validateGeneralWeightParams(&local_320,pWVar9,uVar10,uVar1,&local_340,psVar8,&local_368);
      Result::operator=((Result *)local_48,&local_320);
      Result::~Result(&local_320);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      bVar2 = Result::good((Result *)local_48);
      if (bVar2) {
        pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                           ((UniDirectionalLSTMLayerParams *)&x);
        pWVar9 = Specification::LSTMWeightParams::blockinputweightmatrix(pLVar5);
        uVar1 = err.field_2._8_8_;
        uVar10 = err.field_2._8_8_ * uVar7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b8,"Unidirectional LSTM",&local_3b9);
        psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3e0,"block input gate weight matrix",&local_3e1);
        validateGeneralWeightParams(&local_398,pWVar9,uVar10,uVar1,&local_3b8,psVar8,&local_3e0);
        Result::operator=((Result *)local_48,&local_398);
        Result::~Result(&local_398);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        bVar2 = Result::good((Result *)local_48);
        if (bVar2) {
          pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                             ((UniDirectionalLSTMLayerParams *)&x);
          pWVar9 = Specification::LSTMWeightParams::outputgateweightmatrix(pLVar5);
          uVar1 = err.field_2._8_8_;
          uVar10 = err.field_2._8_8_ * uVar7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_430,"Unidirectional LSTM",&local_431);
          psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_458,"output gate weight matrix",&local_459);
          validateGeneralWeightParams(&local_410,pWVar9,uVar10,uVar1,&local_430,psVar8,&local_458);
          Result::operator=((Result *)local_48,&local_410);
          Result::~Result(&local_410);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator((allocator<char> *)&local_459);
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator((allocator<char> *)&local_431);
          bVar2 = Result::good((Result *)local_48);
          if (bVar2) {
            pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                               ((UniDirectionalLSTMLayerParams *)&x);
            pWVar9 = Specification::LSTMWeightParams::inputgaterecursionmatrix(pLVar5);
            uVar1 = err.field_2._8_8_;
            uVar10 = err.field_2._8_8_ * err.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4a8,"Unidirectional LSTM",&local_4a9);
            psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_4d0,"input gate recursion matrix",&local_4d1);
            validateGeneralWeightParams(&local_488,pWVar9,uVar10,uVar1,&local_4a8,psVar8,&local_4d0)
            ;
            Result::operator=((Result *)local_48,&local_488);
            Result::~Result(&local_488);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
            bVar2 = Result::good((Result *)local_48);
            if (bVar2) {
              pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                 ((UniDirectionalLSTMLayerParams *)&x);
              pWVar9 = Specification::LSTMWeightParams::forgetgaterecursionmatrix(pLVar5);
              uVar1 = err.field_2._8_8_;
              uVar10 = err.field_2._8_8_ * err.field_2._8_8_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_520,"Unidirectional LSTM",&local_521);
              psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_548,"forget gate recursion matrix",&local_549);
              validateGeneralWeightParams
                        (&local_500,pWVar9,uVar10,uVar1,&local_520,psVar8,&local_548);
              Result::operator=((Result *)local_48,&local_500);
              Result::~Result(&local_500);
              std::__cxx11::string::~string((string *)&local_548);
              std::allocator<char>::~allocator((allocator<char> *)&local_549);
              std::__cxx11::string::~string((string *)&local_520);
              std::allocator<char>::~allocator((allocator<char> *)&local_521);
              bVar2 = Result::good((Result *)local_48);
              if (bVar2) {
                pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                   ((UniDirectionalLSTMLayerParams *)&x);
                pWVar9 = Specification::LSTMWeightParams::blockinputrecursionmatrix(pLVar5);
                uVar1 = err.field_2._8_8_;
                uVar10 = err.field_2._8_8_ * err.field_2._8_8_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_598,"Unidirectional LSTM",&local_599);
                psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                   ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_5c0,"block input gate recursion matrix",&local_5c1);
                validateGeneralWeightParams
                          (&local_578,pWVar9,uVar10,uVar1,&local_598,psVar8,&local_5c0);
                Result::operator=((Result *)local_48,&local_578);
                Result::~Result(&local_578);
                std::__cxx11::string::~string((string *)&local_5c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
                std::__cxx11::string::~string((string *)&local_598);
                std::allocator<char>::~allocator((allocator<char> *)&local_599);
                bVar2 = Result::good((Result *)local_48);
                if (bVar2) {
                  pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                     ((UniDirectionalLSTMLayerParams *)&x);
                  pWVar9 = Specification::LSTMWeightParams::outputgaterecursionmatrix(pLVar5);
                  uVar1 = err.field_2._8_8_;
                  uVar10 = err.field_2._8_8_ * err.field_2._8_8_;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_610,"Unidirectional LSTM",&local_611);
                  psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_638,"output gate recursion matrix",&local_639);
                  validateGeneralWeightParams
                            (&local_5f0,pWVar9,uVar10,uVar1,&local_610,psVar8,&local_638);
                  Result::operator=((Result *)local_48,&local_5f0);
                  Result::~Result(&local_5f0);
                  std::__cxx11::string::~string((string *)&local_638);
                  std::allocator<char>::~allocator((allocator<char> *)&local_639);
                  std::__cxx11::string::~string((string *)&local_610);
                  std::allocator<char>::~allocator((allocator<char> *)&local_611);
                  bVar2 = Result::good((Result *)local_48);
                  if (bVar2) {
                    pLVar6 = Specification::UniDirectionalLSTMLayerParams::params
                                       ((UniDirectionalLSTMLayerParams *)&x);
                    bVar2 = Specification::LSTMParams::hasbiasvectors(pLVar6);
                    if (bVar2) {
                      pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar9 = Specification::LSTMWeightParams::inputgatebiasvector(pLVar5);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_688,"Unidirectional LSTM",&local_689);
                      psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_6b0,"input gate bias vector",&local_6b1);
                      validateGeneralWeightParams
                                (&local_668,pWVar9,uVar1,1,&local_688,psVar8,&local_6b0);
                      Result::operator=((Result *)local_48,&local_668);
                      Result::~Result(&local_668);
                      std::__cxx11::string::~string((string *)&local_6b0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
                      std::__cxx11::string::~string((string *)&local_688);
                      std::allocator<char>::~allocator((allocator<char> *)&local_689);
                      bVar2 = Result::good((Result *)local_48);
                      if (bVar2) {
                        pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                           ((UniDirectionalLSTMLayerParams *)&x);
                        pWVar9 = Specification::LSTMWeightParams::forgetgatebiasvector(pLVar5);
                        uVar1 = err.field_2._8_8_;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_700,"Unidirectional LSTM",&local_701);
                        psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_728,"forget gate bias vector",&local_729);
                        validateGeneralWeightParams
                                  (&local_6e0,pWVar9,uVar1,1,&local_700,psVar8,&local_728);
                        Result::operator=((Result *)local_48,&local_6e0);
                        Result::~Result(&local_6e0);
                        std::__cxx11::string::~string((string *)&local_728);
                        std::allocator<char>::~allocator((allocator<char> *)&local_729);
                        std::__cxx11::string::~string((string *)&local_700);
                        std::allocator<char>::~allocator((allocator<char> *)&local_701);
                        bVar2 = Result::good((Result *)local_48);
                        if (bVar2) {
                          pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                             ((UniDirectionalLSTMLayerParams *)&x);
                          pWVar9 = Specification::LSTMWeightParams::blockinputbiasvector(pLVar5);
                          uVar1 = err.field_2._8_8_;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_778,"Unidirectional LSTM",&local_779);
                          psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_7a0,"block input bias vector",&local_7a1);
                          validateGeneralWeightParams
                                    (&local_758,pWVar9,uVar1,1,&local_778,psVar8,&local_7a0);
                          Result::operator=((Result *)local_48,&local_758);
                          Result::~Result(&local_758);
                          std::__cxx11::string::~string((string *)&local_7a0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
                          std::__cxx11::string::~string((string *)&local_778);
                          std::allocator<char>::~allocator((allocator<char> *)&local_779);
                          bVar2 = Result::good((Result *)local_48);
                          if (bVar2) {
                            pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                               ((UniDirectionalLSTMLayerParams *)&x);
                            pWVar9 = Specification::LSTMWeightParams::outputgatebiasvector(pLVar5);
                            uVar1 = err.field_2._8_8_;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_7f0,"Unidirectional LSTM",&local_7f1);
                            psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_818,"output gate bias vector",&local_819);
                            validateGeneralWeightParams
                                      (&local_7d0,pWVar9,uVar1,1,&local_7f0,psVar8,&local_818);
                            Result::operator=((Result *)local_48,&local_7d0);
                            Result::~Result(&local_7d0);
                            std::__cxx11::string::~string((string *)&local_818);
                            std::allocator<char>::~allocator((allocator<char> *)&local_819);
                            std::__cxx11::string::~string((string *)&local_7f0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
                            bVar2 = Result::good((Result *)local_48);
                            if (bVar2) goto LAB_00a2c5bc;
                            Result::Result(__return_storage_ptr__,(Result *)local_48);
                            local_ac = 1;
                          }
                          else {
                            Result::Result(__return_storage_ptr__,(Result *)local_48);
                            local_ac = 1;
                          }
                        }
                        else {
                          Result::Result(__return_storage_ptr__,(Result *)local_48);
                          local_ac = 1;
                        }
                      }
                      else {
                        Result::Result(__return_storage_ptr__,(Result *)local_48);
                        local_ac = 1;
                      }
                    }
                    else {
LAB_00a2c5bc:
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::params
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      bVar2 = Specification::LSTMParams::haspeepholevectors(pLVar6);
                      if (bVar2) {
                        pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                           ((UniDirectionalLSTMLayerParams *)&x);
                        pWVar9 = Specification::LSTMWeightParams::inputgatepeepholevector(pLVar5);
                        uVar1 = err.field_2._8_8_;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_868,"Unidirectional LSTM",&local_869);
                        psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_890,"input gate peep hole vector",&local_891);
                        validateGeneralWeightParams
                                  (&local_848,pWVar9,uVar1,1,&local_868,psVar8,&local_890);
                        Result::operator=((Result *)local_48,&local_848);
                        Result::~Result(&local_848);
                        std::__cxx11::string::~string((string *)&local_890);
                        std::allocator<char>::~allocator((allocator<char> *)&local_891);
                        std::__cxx11::string::~string((string *)&local_868);
                        std::allocator<char>::~allocator((allocator<char> *)&local_869);
                        bVar2 = Result::good((Result *)local_48);
                        if (bVar2) {
                          pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                             ((UniDirectionalLSTMLayerParams *)&x);
                          pWVar9 = Specification::LSTMWeightParams::forgetgatepeepholevector(pLVar5)
                          ;
                          uVar1 = err.field_2._8_8_;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_8e0,"Unidirectional LSTM",&local_8e1);
                          psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_908,"forget gate peep hole vector",&local_909)
                          ;
                          validateGeneralWeightParams
                                    (&local_8c0,pWVar9,uVar1,1,&local_8e0,psVar8,&local_908);
                          Result::operator=((Result *)local_48,&local_8c0);
                          Result::~Result(&local_8c0);
                          std::__cxx11::string::~string((string *)&local_908);
                          std::allocator<char>::~allocator((allocator<char> *)&local_909);
                          std::__cxx11::string::~string((string *)&local_8e0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
                          bVar2 = Result::good((Result *)local_48);
                          if (bVar2) {
                            pLVar5 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                               ((UniDirectionalLSTMLayerParams *)&x);
                            pWVar9 = Specification::LSTMWeightParams::outputgatepeepholevector
                                               (pLVar5);
                            uVar1 = err.field_2._8_8_;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_958,"Unidirectional LSTM",&local_959);
                            psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_980,"output gate peep hole vector",
                                       &local_981);
                            validateGeneralWeightParams
                                      (&local_938,pWVar9,uVar1,1,&local_958,psVar8,&local_980);
                            Result::operator=((Result *)local_48,&local_938);
                            Result::~Result(&local_938);
                            std::__cxx11::string::~string((string *)&local_980);
                            std::allocator<char>::~allocator((allocator<char> *)&local_981);
                            std::__cxx11::string::~string((string *)&local_958);
                            std::allocator<char>::~allocator((allocator<char> *)&local_959);
                            bVar2 = Result::good((Result *)local_48);
                            if (bVar2) goto LAB_00a2cbb7;
                            Result::Result(__return_storage_ptr__,(Result *)local_48);
                            local_ac = 1;
                          }
                          else {
                            Result::Result(__return_storage_ptr__,(Result *)local_48);
                            local_ac = 1;
                          }
                        }
                        else {
                          Result::Result(__return_storage_ptr__,(Result *)local_48);
                          local_ac = 1;
                        }
                      }
                      else {
LAB_00a2cbb7:
                        Result::Result(__return_storage_ptr__,(Result *)local_48);
                        local_ac = 1;
                      }
                    }
                  }
                  else {
                    Result::Result(__return_storage_ptr__,(Result *)local_48);
                    local_ac = 1;
                  }
                }
                else {
                  Result::Result(__return_storage_ptr__,(Result *)local_48);
                  local_ac = 1;
                }
              }
              else {
                Result::Result(__return_storage_ptr__,(Result *)local_48);
                local_ac = 1;
              }
            }
            else {
              Result::Result(__return_storage_ptr__,(Result *)local_48);
              local_ac = 1;
            }
          }
          else {
            Result::Result(__return_storage_ptr__,(Result *)local_48);
            local_ac = 1;
          }
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_ac = 1;
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
    }
  }
  else {
    psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_280,"Unidirectional LSTM layer:",psVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   &local_280," must provide 3 activations");
    std::__cxx11::string::~string((string *)&local_280);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_260);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_260);
  }
  Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)&x);
LAB_00a2cbed:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 3);
    if (r.good()) {
        r = validateOutputCount(layer, 3, 3);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "output gate weight matrix");
    if(!r.good()) return r;
    // Check recursion matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "output gate recursion matrix");
    if(!r.good()) return r;
    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate peep hole vector");
        if(!r.good()) return r;
    }

    return r;
}